

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer-real-time.cpp
# Opt level: O1

void __thiscall dynamicgraph::TracerRealTime::closeFiles(TracerRealTime *this)

{
  undefined8 *puVar1;
  _List_node_base *p_Var2;
  long *plVar3;
  int iVar4;
  long *plVar5;
  undefined8 uVar6;
  undefined1 *__mutex;
  
  __mutex = &this->field_0xf0;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 == 0) {
    p_Var2 = (_List_node_base *)&this->hardFiles;
    for (puVar1 = *(undefined8 **)&this->field_0x190; (undefined8 *)&this->field_0x190 != puVar1;
        puVar1 = (undefined8 *)*puVar1) {
      p_Var2 = (((_List_base<std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_*>_>
                  *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (puVar1[2] == 0) {
        plVar5 = (long *)0x0;
      }
      else {
        plVar5 = (long *)__dynamic_cast(puVar1[2],&std::ostream::typeinfo,
                                        &std::__cxx11::stringstream::typeinfo,0x10);
      }
      plVar3 = (long *)p_Var2[1]._M_next;
      std::ostream::flush();
      std::ofstream::close();
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 8))(plVar5);
      }
      (**(code **)(*plVar3 + 8))(plVar3);
    }
    std::__cxx11::
    list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
    ::clear((list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
             *)&this->field_0x190);
    std::__cxx11::
    list<std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_*>_>
    ::clear(&this->hardFiles);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar6 = std::__throw_system_error(iVar4);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar6);
}

Assistant:

void TracerRealTime::closeFiles() {
  dgDEBUGIN(15);
  std::lock_guard<std::mutex> files_lock(files_mtx);

  FileList::iterator iter = files.begin();
  HardFileList::iterator hardIter = hardFiles.begin();

  while (files.end() != iter) {
    dgDEBUG(25) << "Close the files." << endl;

    std::stringstream *file = dynamic_cast<stringstream *>(*iter);
    std::ofstream *hardFile = *hardIter;

    (*hardFile) << flush;
    hardFile->close();
    delete file;
    delete hardFile;

    ++iter;
    ++hardIter;
  }

  dgDEBUG(25) << "Clear the lists." << endl;
  files.clear();
  hardFiles.clear();

  dgDEBUGOUT(15);
}